

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(void)

{
  char cVar1;
  
  _generate_nonce = nonce_override_generate_nonce;
  cVar1 = paseto_init();
  if (cVar1 != '\0') {
    run_tests();
    test_v2vectors();
    test_v2publicvectors();
    return 0;
  }
  __assert_fail("paseto_init()",
                "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/main.c"
                ,9,"int main()");
}

Assistant:

int main() {
    generate_nonce = nonce_override_generate_nonce;
    assert(paseto_init());
    run_tests();
    test_v2vectors();
    test_v2publicvectors();
}